

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall HFactor::buildSimple(HFactor *this)

{
  int *piVar1;
  double value;
  pointer piVar2;
  pointer pdVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  pointer piVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  int8_t *__x;
  HighsInt *pHVar13;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  size_type sVar17;
  ulong uVar18;
  int iVar19;
  HighsInt iRow_4;
  ulong uVar20;
  long lVar21;
  HighsInt i;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int8_t pivot_type;
  HighsInt iMat;
  HighsInt iRow_1;
  uint uStack_104;
  HighsInt iRow;
  uint local_fc;
  vector<int,_std::allocator<int>_> *local_f8;
  vector<signed_char,_std::allocator<signed_char>_> *local_f0;
  vector<int,_std::allocator<int>_> *local_e8;
  vector<int,_std::allocator<int>_> *local_e0;
  vector<int,_std::allocator<int>_> *local_d8;
  vector<double,_std::allocator<double>_> *local_d0;
  vector<int,_std::allocator<int>_> *local_c8;
  vector<int,_std::allocator<int>_> *local_c0;
  ulong local_b8;
  double local_b0;
  ulong local_a8;
  vector<double,_std::allocator<double>_> *local_a0;
  vector<double,_std::allocator<double>_> *local_98;
  vector<int,_std::allocator<int>_> *local_90;
  int local_88;
  int local_84;
  long local_80;
  double local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  luClear(this);
  iVar6 = this->num_basic;
  std::vector<int,_std::allocator<int>_>::resize(&this->permute,(long)iVar6);
  iRow_1 = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&this->permute,(long)iVar6,&iRow_1);
  iRow_1 = 0;
  std::__fill_n_a<int*,int,int>
            ((this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,this->num_row,&iRow_1);
  this->nwork = 0;
  sVar17 = (long)this->num_basic + 1;
  iRow_1 = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->iwork,sVar17,&iRow_1);
  _iRow_1 = (double)((ulong)uStack_104 << 0x20);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&this->iwork,sVar17,&iRow_1);
  local_c0 = &this->l_start;
  local_98 = (vector<double,_std::allocator<double>_> *)&this->l_index;
  local_c8 = &this->u_pivot_index;
  local_d0 = &this->u_pivot_value;
  local_d8 = &this->u_start;
  local_f8 = &this->u_index;
  local_e0 = &(this->refactor_info_).pivot_row;
  local_e8 = &(this->refactor_info_).pivot_var;
  local_f0 = &(this->refactor_info_).pivot_type;
  iVar6 = 0;
  for (lVar10 = 0; lVar10 < this->num_basic; lVar10 = lVar10 + 1) {
    iMat = this->basic_index[lVar10];
    iRow = -1;
    pivot_type = -1;
    if (iMat < this->num_col) {
      iVar19 = this->a_start[iMat];
      lVar8 = (long)iVar19;
      iVar12 = this->a_start[(long)iMat + 1];
      if (iVar12 - iVar19 == 1) {
        pHVar13 = this->a_index;
        pdVar16 = this->a_value;
        piVar7 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (((pdVar16[lVar8] == 1.0) && (!NAN(pdVar16[lVar8]))) && (-1 < piVar7[pHVar13[lVar8]])) {
          pivot_type = '\x03';
          iRow = pHVar13[lVar8];
          goto LAB_00353f72;
        }
      }
      else {
        pHVar13 = this->a_index;
        pdVar16 = this->a_value;
        piVar7 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      piVar2 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar14 = 0; lVar8 + lVar14 < (long)iVar12; lVar14 = lVar14 + 1) {
        piVar7[pHVar13[lVar8 + lVar14]] = piVar7[pHVar13[lVar8 + lVar14]] + 1;
        piVar2[iVar6 + lVar14] = pHVar13[lVar8 + lVar14];
        pdVar3[iVar6 + lVar14] = pdVar16[lVar8 + lVar14];
      }
      iVar19 = iVar6 + (int)lVar14;
LAB_00353f54:
      iVar6 = this->nwork;
      this->nwork = iVar6 + 1;
      (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar6] = (int)lVar10;
      iVar6 = iVar19;
    }
    else {
      iVar12 = iMat - this->num_col;
      piVar7 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar19 = piVar7[iVar12];
      if (iVar19 < 0) {
        piVar7[iVar12] = iVar19 + 1;
        (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6] = iVar12;
        iVar19 = iVar6 + 1;
        (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6] = 1.0;
        goto LAB_00353f54;
      }
      pivot_type = '\0';
      iRow = iVar12;
    }
LAB_00353f72:
    if (-1 < iRow) {
      (this->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = iRow;
      _iRow_1 = (double)CONCAT44(uStack_104,
                                 (int)((ulong)((long)(this->l_index).
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this->l_index).
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start) >> 2))
      ;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_c0,&iRow_1);
      std::vector<int,_std::allocator<int>_>::push_back(local_c8,&iRow);
      _iRow_1 = 1.0;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(local_d0,(double *)&iRow_1)
      ;
      _iRow_1 = (double)CONCAT44(uStack_104,
                                 (int)((ulong)((long)(this->u_index).
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this->u_index).
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start) >> 2))
      ;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d8,&iRow_1);
      (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iRow] = -this->num_basic;
      std::vector<int,_std::allocator<int>_>::push_back(local_e0,&iRow);
      std::vector<int,_std::allocator<int>_>::push_back(local_e8,&iMat);
      std::vector<signed_char,_std::allocator<signed_char>_>::push_back(local_f0,&pivot_type);
    }
    (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar10 + 1] = iVar6;
    (this->b_var).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar10] = iMat;
  }
  uVar5 = this->nwork;
  iVar19 = this->num_row - uVar5;
  this->basis_matrix_num_el = iVar19 + iVar6;
  this->build_synthetic_tick = (double)(iVar19 * 0x50 + iVar6 * 0x3c) + this->build_synthetic_tick;
  lVar10 = (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar8 = lVar10 >> 2;
  auVar22._8_4_ = (int)(lVar10 >> 0x22);
  auVar22._0_8_ = lVar8;
  auVar22._12_4_ = 0x45300000;
  dStack_50 = auVar22._8_8_ - 1.9342813113834067e+25;
  local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
  lVar10 = (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar8 = lVar10 >> 2;
  auVar23._8_4_ = (int)(lVar10 >> 0x22);
  auVar23._0_8_ = lVar8;
  auVar23._12_4_ = 0x45300000;
  dStack_40 = auVar23._8_8_ - 1.9342813113834067e+25;
  local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
  local_78 = (double)(int)uVar5;
  local_a0 = &this->u_value;
  local_b0 = 0.0;
  do {
    uVar15 = (ulong)uVar5;
    uVar9 = uVar5;
    if ((int)uVar5 < 1) break;
    this->nwork = 0;
    local_fc = uVar5;
    local_68 = uVar15;
    for (uVar11 = 0; uVar9 = (uint)uVar15, uVar11 != local_68; uVar11 = uVar11 + 1) {
      piVar7 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = piVar7[uVar11];
      local_80 = (long)iVar6;
      iVar19 = piVar2[local_80];
      uVar18 = (ulong)iVar19;
      iVar12 = piVar2[local_80 + 1];
      local_a8 = (ulong)iVar12;
      local_b0 = local_b0 + (double)(iVar12 - iVar19);
      lVar10 = uVar18 << 0x20;
      iVar19 = 0;
      uVar15 = 0xffffffffffffffff;
      uVar20 = uVar18;
LAB_003541b7:
      if ((long)uVar20 < (long)local_a8) {
        iVar12 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar20]];
        if (iVar12 != 1) goto code_r0x003541cc;
        local_70 = lVar10 >> 0x20;
        local_90 = (vector<int,_std::allocator<int>_> *)
                   (1.0 / *(double *)
                           ((long)(this->b_value).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start + (lVar10 >> 0x1d)));
        local_88 = (int)uVar20 + 1;
        iVar6 = 0;
        local_b8 = uVar11;
        local_60 = uVar18;
        while (lVar8 = local_70, lVar10 = local_80, iVar6 != 2) {
          uVar15 = local_a8;
          iVar19 = local_88;
          if (iVar6 == 0) {
            iVar19 = (int)local_60;
            uVar15 = uVar20;
          }
          lVar8 = (long)iVar19;
          lVar10 = lVar8 * 8;
          local_84 = iVar6;
          for (; lVar8 < (int)uVar15; lVar8 = lVar8 + 1) {
            iMat = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8];
            if ((this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iMat] < 1) {
              std::vector<int,_std::allocator<int>_>::push_back(local_f8,&iMat);
              std::vector<double,_std::allocator<double>_>::push_back
                        (local_a0,(value_type_conflict1 *)
                                  ((long)(this->b_value).
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start + lVar10));
            }
            else {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)local_98,&iMat);
              _iRow_1 = (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar8] * (double)local_90;
              std::vector<double,_std::allocator<double>_>::emplace_back<double>
                        (&this->l_value,(double *)&iRow_1);
            }
            piVar1 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + iMat;
            *piVar1 = *piVar1 + -1;
            lVar10 = lVar10 + 8;
          }
          iVar6 = local_84 + 1;
        }
        iVar6 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[local_70];
        _iRow_1 = (double)CONCAT44(uStack_104,iVar6);
        (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6] = 0;
        (this->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[local_80] = iVar6;
        iMat = (HighsInt)
               ((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_c0,&iMat);
        std::vector<int,_std::allocator<int>_>::push_back(local_c8,&iRow_1);
        std::vector<double,_std::allocator<double>_>::push_back
                  (local_d0,(this->b_value).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar8);
        iMat = (HighsInt)
               ((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d8,&iMat);
        std::vector<int,_std::allocator<int>_>::push_back(local_e0,&iRow_1);
        std::vector<int,_std::allocator<int>_>::push_back(local_e8,this->basic_index + lVar10);
        __x = "\x02\x03\x04buildRankDeficiency0:";
        goto LAB_003545a0;
      }
      if (iVar19 == 1) {
        lVar14 = (long)(int)uVar15;
        lVar10 = uVar18 * 4;
        lVar8 = uVar18 * 8;
        local_b8 = uVar11;
        for (; (long)uVar18 < lVar14; uVar18 = uVar18 + 1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (local_f8,(value_type_conflict2 *)
                              ((long)(this->b_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar10));
          std::vector<double,_std::allocator<double>_>::push_back
                    (local_a0,(value_type_conflict1 *)
                              ((long)(this->b_value).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar8));
          lVar10 = lVar10 + 4;
          lVar8 = lVar8 + 8;
        }
        lVar10 = lVar14 * 4;
        lVar8 = lVar14 * 8;
        lVar21 = lVar14;
        while( true ) {
          lVar4 = local_80;
          lVar10 = lVar10 + 4;
          lVar21 = lVar21 + 1;
          lVar8 = lVar8 + 8;
          if ((long)local_a8 <= lVar21) break;
          std::vector<int,_std::allocator<int>_>::push_back
                    (local_f8,(value_type_conflict2 *)
                              ((long)(this->b_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start + lVar10));
          std::vector<double,_std::allocator<double>_>::push_back
                    (local_a0,(value_type_conflict1 *)
                              ((long)(this->b_value).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar8));
        }
        iVar6 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar14];
        _iRow_1 = (double)CONCAT44(uStack_104,iVar6);
        (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar6] = 0;
        (this->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[local_80] = iVar6;
        iMat = (HighsInt)
               ((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_c0,&iMat);
        std::vector<int,_std::allocator<int>_>::push_back(local_c8,&iRow_1);
        std::vector<double,_std::allocator<double>_>::push_back
                  (local_d0,(this->b_value).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar14);
        iMat = (HighsInt)
               ((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_d8,&iMat);
        std::vector<int,_std::allocator<int>_>::push_back(local_e0,&iRow_1);
        std::vector<int,_std::allocator<int>_>::push_back(local_e8,this->basic_index + lVar4);
        __x = "\x03\x04buildRankDeficiency0:";
LAB_003545a0:
        std::vector<signed_char,_std::allocator<signed_char>_>::push_back(local_f0,__x);
        uVar11 = local_b8;
      }
      else {
        iVar19 = this->nwork;
        this->nwork = iVar19 + 1;
        piVar7[iVar19] = iVar6;
      }
      uVar15 = (ulong)local_fc;
    }
    uVar5 = this->nwork;
  } while (uVar9 != uVar5);
  lVar10 = (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar8 = lVar10 >> 2;
  auVar24._8_4_ = (int)(lVar10 >> 0x22);
  auVar24._0_8_ = lVar8;
  auVar24._12_4_ = 0x45300000;
  lVar10 = (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar14 = lVar10 >> 2;
  auVar25._8_4_ = (int)(lVar10 >> 0x22);
  auVar25._0_8_ = lVar14;
  auVar25._12_4_ = 0x45300000;
  this->build_synthetic_tick =
       local_b0 * 20.0 +
       ((local_78 - (double)(int)uVar9) +
        (((auVar24._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) - local_58) +
       (((auVar25._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0)) - local_48)) * 80.0 +
       this->build_synthetic_tick;
  iRow_1 = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->row_link_first,(long)this->num_basic + 1,&iRow_1);
  _iRow_1 = (double)((ulong)uStack_104 << 0x20);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->mr_count,(long)this->num_row,&iRow_1);
  this->kernel_num_el = 0;
  sVar17 = 0;
  for (lVar10 = 0; lVar10 < this->num_row; lVar10 = lVar10 + 1) {
    iVar6 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10];
    if (0 < iVar6) {
      (this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar10] = (int)sVar17;
      (this->mr_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar10] = iVar6 * 2;
      sVar17 = (size_type)(uint)((int)sVar17 + iVar6 * 2);
      rlinkAdd(this,(HighsInt)lVar10,iVar6);
      this->kernel_num_el = this->kernel_num_el + iVar6 + 1;
    }
  }
  local_f8 = (vector<int,_std::allocator<int>_> *)sVar17;
  std::vector<int,_std::allocator<int>_>::resize(&this->mr_index,sVar17);
  iRow_1 = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->col_link_first,(long)this->num_row + 1,&iRow_1);
  piVar7 = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar7) {
    (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar7;
  }
  iVar6 = this->num_basic;
  pdVar3 = (this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    (this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar3;
  }
  local_90 = &this->mc_index;
  local_98 = &this->mc_value;
  iRow_1 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&this->mc_count_a,(long)iVar6,&iRow_1);
  _iRow_1 = (double)((ulong)uStack_104 << 0x20);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(&this->mc_count_n,(long)iVar6,&iRow_1);
  iVar6 = 0;
  for (lVar10 = 0; iVar19 = this->nwork, lVar10 < iVar19; lVar10 = lVar10 + 1) {
    iVar19 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar10];
    (this->mc_var).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar19] =
         (this->b_var).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_start[iVar19];
    (this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar19] = iVar6;
    piVar7 = (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar12 = piVar7[(long)iVar19 + 1] - piVar7[iVar19];
    (this->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar19] = iVar12 * 2;
    iVar6 = iVar6 + iVar12 * 2;
    std::vector<int,_std::allocator<int>_>::resize(local_90,(long)iVar6);
    std::vector<double,_std::allocator<double>_>::resize(local_98,(long)iVar6);
    piVar7 = (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar8 = (long)piVar7[iVar19]; lVar8 < piVar7[(long)iVar19 + 1]; lVar8 = lVar8 + 1) {
      iVar12 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
      value = (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      if ((this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar12] < 1) {
        colStoreN(this,iVar19,iVar12,value);
      }
      else {
        colInsert(this,iVar19,iVar12,value);
        rowInsert(this,iVar19,iVar12);
      }
      piVar7 = (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    colFixMax(this,iVar19);
    clinkAdd(this,iVar19,
             (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar19]);
  }
  this->build_synthetic_tick =
       (double)((int)local_f8 * 0x14 + (iVar6 + iVar19 + this->num_row) * 0x28) +
       this->build_synthetic_tick;
  this->kernel_dim = iVar19;
  return;
code_r0x003541cc:
  if (1 < iVar12) {
    uVar15 = uVar20;
  }
  uVar15 = uVar15 & 0xffffffff;
  iVar19 = iVar19 + (uint)(1 < iVar12);
  uVar20 = uVar20 + 1;
  lVar10 = lVar10 + 0x100000000;
  goto LAB_003541b7;
}

Assistant:

void HFactor::buildSimple() {
  /**
   * 0. Clear L and U factor
   */
  luClear();

  const bool progress_report = false;
  const HighsInt progress_frequency = 100000;

  // Set all values of permute to -1 so that unpermuted (rank
  // deficient) columns can be identified
  const HighsInt permute_dim = num_basic;
  // Strictly not necessary, but nice if it's the right size
  permute.resize(permute_dim);
  permute.assign(permute_dim, -1);

  /**
   * 1. Prepare basis matrix and deal with unit columns
   */
  const bool report_unit = false;
  const bool report_singletons = false;
  const bool report_markowitz = false;
  const bool report_anything =
      report_unit || report_singletons || report_markowitz;
  HighsInt BcountX = 0;
  fill_n(mr_count_before.data(), num_row, 0);
  nwork = 0;
  if (report_anything) printf("\nFactor\n");
  // Compile a vector iwork of the indices within basic_index of the
  // its nwork non-unit structural columns: they will be formed into
  // the B matrix as the kernel
  const HighsInt iwork_dim = num_basic;
  // Strictly not necessary, but nice if it's the right size
  iwork.resize(iwork_dim + 1, 0);
  iwork.assign(iwork_dim + 1, 0);
  for (HighsInt iCol = 0; iCol < num_basic; iCol++) {
    if (progress_report && iCol) {
      if (iCol % progress_frequency == 0)
        printf("HFactor::buildSimple stage = %6d\n", (int)iCol);
    }

    HighsInt iMat = basic_index[iCol];
    HighsInt iRow = -1;
    int8_t pivot_type = kPivotIllegal;
    // Look for unit columns as pivots. If there is already a pivot
    // corresponding to the nonzero in a unit column - evidenced by
    // mr_count_before[iRow] being negative - then, obviously, it
    // can't be used. However, it doesn't imply an error, or even rank
    // deficiency now that build() is being used to determine
    // rank. Treat it as a column to be handled in the kernel, so that
    // any rank deficiency or singularity is detected as late as
    // possible.
    if (iMat >= num_col) {
      // 1.1 Logical column
      //
      // Check for double pivot
      HighsInt lc_iRow = iMat - num_col;
      if (mr_count_before[lc_iRow] >= 0) {
        if (report_unit)
          printf("Stage %d: Logical\n", (int)(l_start.size() - 1));
        pivot_type = kPivotLogical;
        iRow = lc_iRow;
      } else {
        mr_count_before[lc_iRow]++;
        b_index[BcountX] = lc_iRow;
        b_value[BcountX++] = 1.0;
        iwork[nwork++] = iCol;
      }
    } else {
      // 1.2 Structural column
      HighsInt start = a_start[iMat];
      HighsInt count = a_start[iMat + 1] - start;
      // If this column and all subsequent columns are zero (so count
      // is 0) then a_index[start] and a_value[start] are unassigned,
      // so determine a unit column in two stages
      bool ok_unit_col = false;
      if (count == 1) {
        // Column has only one nonzero, but have to make sure that the
        // value is 1 and that there's not already a pivot
        // corresponding to this unit column
        ok_unit_col =
            a_value[start] == 1 && mr_count_before[a_index[start]] >= 0;
      }
      if (ok_unit_col) {
        if (report_unit) printf("Stage %d: Unit\n", (int)(l_start.size() - 1));
        // Don't exploit this special case in case the matrix is
        // re-factorized after scaling has been applied, making this
        // column non-unit.
        pivot_type = kPivotColSingleton;  //;kPivotUnit;//
        iRow = a_index[start];
      } else {
        for (HighsInt k = start; k < start + count; k++) {
          mr_count_before[a_index[k]]++;
          assert(BcountX < (HighsInt)b_index.size());
          b_index[BcountX] = a_index[k];
          b_value[BcountX++] = a_value[k];
        }
        iwork[nwork++] = iCol;
      }
    }

    if (iRow >= 0) {
      // 1.3 Record unit column
      permute[iCol] = iRow;
      l_start.push_back(l_index.size());
      u_pivot_index.push_back(iRow);
      u_pivot_value.push_back(1);
      u_start.push_back(u_index.size());
      // Was -num_row, but this is incorrect since the negation needs
      // to be great enough so that, starting from it, the accumulated
      // count can never reach zero
      mr_count_before[iRow] = -num_basic;
      assert(pivot_type != kPivotIllegal);
      this->refactor_info_.pivot_row.push_back(iRow);
      this->refactor_info_.pivot_var.push_back(iMat);
      this->refactor_info_.pivot_type.push_back(pivot_type);
    }
    b_start[iCol + 1] = BcountX;
    b_var[iCol] = iMat;
  }
  // Record the number of elements in the basis matrix
  basis_matrix_num_el = num_row - nwork + BcountX;

  // count1 = 0;
  // Comments: for pds-20, dfl001: 60 / 80
  // Comments: when system is large: enlarge
  // Comments: when system is small: decrease
  build_synthetic_tick += BcountX * 60 + (num_row - nwork) * 80;

  /**
   * 2. Search for and deal with singletons
   */
  double t2_search = 0;
  double t2_store_l = l_index.size();
  double t2_store_u = u_index.size();
  double t2_store_p = nwork;
  while (nwork > 0) {
    HighsInt nworkLast = nwork;
    nwork = 0;
    for (HighsInt i = 0; i < nworkLast; i++) {
      const HighsInt iCol = iwork[i];
      const HighsInt start = b_start[iCol];
      const HighsInt end = b_start[iCol + 1];
      HighsInt pivot_k = -1;
      HighsInt found_row_singleton = 0;
      HighsInt count = 0;

      // 2.1 Search for singleton
      t2_search += end - start;
      for (HighsInt k = start; k < end; k++) {
        const HighsInt iRow = b_index[k];
        if (mr_count_before[iRow] == 1) {
          pivot_k = k;
          found_row_singleton = 1;
          break;
        }
        if (mr_count_before[iRow] > 1) {
          pivot_k = k;
          count++;
        }
      }

      if (found_row_singleton) {
        // 2.2 Deal with row singleton
        const double pivot_multiplier = 1 / b_value[pivot_k];
        if (report_singletons)
          printf("Stage %d: Row singleton (%4d, %g)\n",
                 (int)(l_start.size() - 1), (int)pivot_k, pivot_multiplier);
        for (HighsInt section = 0; section < 2; section++) {
          HighsInt p0 = section == 0 ? start : pivot_k + 1;
          HighsInt p1 = section == 0 ? pivot_k : end;
          for (HighsInt k = p0; k < p1; k++) {
            HighsInt iRow = b_index[k];
            if (mr_count_before[iRow] > 0) {
              if (report_singletons)
                printf("Row singleton: L En (%4d, %11.4g)\n", (int)iRow,
                       b_value[k] * pivot_multiplier);
              l_index.push_back(iRow);
              l_value.push_back(b_value[k] * pivot_multiplier);
            } else {
              if (report_singletons)
                printf("Row singleton: U En (%4d, %11.4g)\n", (int)iRow,
                       b_value[k]);
              u_index.push_back(iRow);
              u_value.push_back(b_value[k]);
            }
            mr_count_before[iRow]--;
          }
        }
        HighsInt iRow = b_index[pivot_k];
        mr_count_before[iRow] = 0;
        permute[iCol] = iRow;
        l_start.push_back(l_index.size());

        if (report_singletons)
          printf("Row singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 b_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(b_value[pivot_k]);
        u_start.push_back(u_index.size());
        assert(b_var[iCol] == basic_index[iCol]);

        this->refactor_info_.pivot_row.push_back(iRow);
        this->refactor_info_.pivot_var.push_back(basic_index[iCol]);
        this->refactor_info_.pivot_type.push_back(kPivotRowSingleton);
      } else if (count == 1) {
        if (report_singletons)
          printf("Stage %d: Col singleton \n", (int)(l_start.size() - 1));
        // 2.3 Deal with column singleton
        for (HighsInt k = start; k < pivot_k; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)b_index[k],
                   b_value[k]);
          u_index.push_back(b_index[k]);
          u_value.push_back(b_value[k]);
        }
        for (HighsInt k = pivot_k + 1; k < end; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)b_index[k],
                   b_value[k]);
          u_index.push_back(b_index[k]);
          u_value.push_back(b_value[k]);
        }

        HighsInt iRow = b_index[pivot_k];
        mr_count_before[iRow] = 0;
        permute[iCol] = iRow;
        l_start.push_back(l_index.size());

        if (report_singletons)
          printf("Col singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 b_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(b_value[pivot_k]);
        u_start.push_back(u_index.size());
        assert(b_var[iCol] == basic_index[iCol]);
        this->refactor_info_.pivot_row.push_back(iRow);
        this->refactor_info_.pivot_var.push_back(basic_index[iCol]);
        this->refactor_info_.pivot_type.push_back(kPivotColSingleton);
      } else {
        iwork[nwork++] = iCol;
      }
    }

    // No singleton found in the last pass
    if (nworkLast == nwork) break;
  }
  if (report_anything) reportLu(kReportLuBoth, false);
  t2_store_l = static_cast<double>(l_index.size()) - t2_store_l;
  t2_store_u = static_cast<double>(u_index.size()) - t2_store_u;
  t2_store_p = t2_store_p - nwork;

  build_synthetic_tick +=
      t2_search * 20 + (t2_store_p + t2_store_l + t2_store_u) * 80;

  /**
   * 3. Prepare the kernel parts
   */
  // 3.1 Prepare row links, row matrix spaces
  row_link_first.assign(num_basic + 1, -1);
  mr_count.assign(num_row, 0);
  HighsInt mr_countX = 0;
  // Determine the number of entries in the kernel
  kernel_num_el = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt count = mr_count_before[iRow];
    if (count > 0) {
      mr_start[iRow] = mr_countX;
      mr_space[iRow] = count * 2;
      mr_countX += count * 2;
      rlinkAdd(iRow, count);
      kernel_num_el += count + 1;
    }
  }
  mr_index.resize(mr_countX);

  // 3.2 Prepare column links, kernel matrix
  col_link_first.assign(num_row + 1, -1);
  const HighsInt mc_dim = num_basic;
  mc_index.clear();
  mc_value.clear();
  mc_count_a.assign(mc_dim, 0);
  mc_count_n.assign(mc_dim, 0);
  HighsInt MCcountX = 0;
  for (HighsInt i = 0; i < nwork; i++) {
    HighsInt iCol = iwork[i];
    mc_var[iCol] = b_var[iCol];
    mc_start[iCol] = MCcountX;
    mc_space[iCol] = (b_start[iCol + 1] - b_start[iCol]) * 2;
    MCcountX += mc_space[iCol];
    mc_index.resize(MCcountX);
    mc_value.resize(MCcountX);
    for (HighsInt k = b_start[iCol]; k < b_start[iCol + 1]; k++) {
      const HighsInt iRow = b_index[k];
      const double value = b_value[k];
      if (mr_count_before[iRow] > 0) {
        colInsert(iCol, iRow, value);
        rowInsert(iCol, iRow);
      } else {
        colStoreN(iCol, iRow, value);
      }
    }
    colFixMax(iCol);
    clinkAdd(iCol, mc_count_a[iCol]);
  }
  build_synthetic_tick += (num_row + nwork + MCcountX) * 40 + mr_countX * 20;
  // Record the kernel dimension
  kernel_dim = nwork;
  assert((HighsInt)this->refactor_info_.pivot_row.size() == num_basic - nwork);
}